

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# port.h
# Opt level: O0

void __thiscall google::protobuf::internal::RealDebugCounter::Inc(RealDebugCounter *this)

{
  size_t sVar1;
  RealDebugCounter *this_local;
  memory_order __b;
  
  sVar1 = value(this);
  std::operator&(memory_order_relaxed,__memory_order_mask);
  (this->counter_).super___atomic_base<unsigned_long>._M_i = sVar1 + 1;
  return;
}

Assistant:

void Inc() { counter_.store(value() + 1, std::memory_order_relaxed); }